

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

uint __thiscall Engine::getLocalFunctionNameByString(Engine *this,string *name)

{
  __type _Var1;
  uint local_24;
  uint i;
  string *name_local;
  Engine *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->localFunctionsCount <= local_24) {
      return 0xffffffff;
    }
    _Var1 = std::operator==(this->localFunctionNames + (ulong)local_24 * 0x20,name);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

unsigned int Engine::getLocalFunctionNameByString(std::string name) {
	unsigned int i;
	for (i = 0; i < this->localFunctionsCount; i++) {
		if (this->localFunctionNames[i] == name) {
			return i;
		}
	}
	return CANT_FIND;
}